

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O3

void rr::resolveMultisampleColorBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  int y;
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector<float,_4> res;
  ConstPixelBufferAccess local_58;
  
  iVar2 = (src->m_access).m_size.m_data[0];
  if (iVar2 == 1) {
    MultisampleConstPixelBufferAccess::toSinglesampleAccess(&local_58,src);
    tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)&local_58);
  }
  else {
    iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
    if (0 < iVar1) {
      fVar7 = 1.0 / (float)iVar2;
      iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
      y = 0;
      do {
        if (0 < iVar2) {
          iVar1 = 0;
          do {
            if ((src->m_access).m_size.m_data[0] < 1) {
              fVar3 = 0.0;
              fVar4 = 0.0;
              fVar5 = 0.0;
              fVar6 = 0.0;
            }
            else {
              iVar2 = 0;
              fVar3 = 0.0;
              fVar4 = 0.0;
              fVar5 = 0.0;
              fVar6 = 0.0;
              do {
                tcu::ConstPixelBufferAccess::getPixel(&local_58,(int)src,iVar2,iVar1);
                fVar3 = fVar3 + (float)local_58.m_format.order;
                fVar4 = fVar4 + (float)local_58.m_format.type;
                fVar5 = fVar5 + (float)local_58.m_size.m_data[0];
                fVar6 = fVar6 + (float)local_58.m_size.m_data[1];
                iVar2 = iVar2 + 1;
              } while (iVar2 < (src->m_access).m_size.m_data[0]);
            }
            local_58.m_format.order = (ChannelOrder)(fVar3 * fVar7);
            local_58.m_format.type = (ChannelType)(fVar4 * fVar7);
            local_58.m_size.m_data[0] = (int)(fVar5 * fVar7);
            local_58.m_size.m_data[1] = (int)(fVar6 * fVar7);
            tcu::PixelBufferAccess::setPixel(dst,(Vec4 *)&local_58,iVar1,y,0);
            iVar1 = iVar1 + 1;
            iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
          } while (iVar1 < iVar2);
          iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
        }
        y = y + 1;
      } while (y < iVar1);
    }
  }
  return;
}

Assistant:

void resolveMultisampleColorBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(dst, src.toSinglesampleAccess());
	}
	else
	{
		const float numSamplesInv = 1.0f / (float)src.getNumSamples();

		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
		{
			tcu::Vec4 sum;
			for (int s = 0; s < src.raw().getWidth(); s++)
				sum += src.raw().getPixel(s, x, y);

			dst.setPixel(sum*numSamplesInv, x, y);
		}
	}
}